

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

value * __thiscall mjs::value::operator=(value *this,value *rhs)

{
  wostream *os;
  wstring local_1d0 [32];
  wstring_view local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream _woss;
  value *rhs_local;
  value *this_local;
  
  if (this != rhs) {
    destroy(this);
    switch(rhs->type_) {
    case undefined:
      break;
    case null:
      break;
    case boolean:
      (this->field_1).field5[0] = (rhs->field_1).field5[0] & 1;
      break;
    case number:
      (this->field_1).n_ = (rhs->field_1).n_;
      break;
    case string:
      string::string(&(this->field_1).s_,&(rhs->field_1).s_);
      break;
    case object:
      gc_heap_ptr<mjs::object>::gc_heap_ptr
                ((gc_heap_ptr<mjs::object> *)&(this->field_1).s_,
                 (gc_heap_ptr<mjs::object> *)&(rhs->field_1).s_);
      break;
    case reference:
      reference::reference(&(this->field_1).r_,&(rhs->field_1).r_);
      break;
    default:
      std::__cxx11::wostringstream::wostringstream(local_190);
      os = std::operator<<((wostream *)local_190,"Not implemented: ");
      mjs::operator<<(os,rhs->type_);
      std::__cxx11::wostringstream::str();
      local_1b0[0] = (wstring_view)
                     std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1d0);
      throw_runtime_error(local_1b0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                          ,0x33);
    }
    this->type_ = rhs->type_;
  }
  return this;
}

Assistant:

value& value::operator=(const value& rhs) {
    if (this != &rhs) {
        destroy();
        switch (rhs.type_) {
        case value_type::undefined: break;
        case value_type::null:      break;
        case value_type::boolean:   b_ = rhs.b_; break;
        case value_type::number:    n_ = rhs.n_; break;
        case value_type::string:    new (&s_) string{rhs.s_}; break;
        case value_type::object:    new (&o_) object_ptr{rhs.o_}; break;
        case value_type::reference: new (&r_) reference{rhs.r_}; break;
        default: NOT_IMPLEMENTED(rhs.type_);
        }
        type_ = rhs.type_;
    }
    return *this;
}